

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NinjaCommand.cpp
# Opt level: O3

BuildResult __thiscall
anon_unknown.dwarf_7e301::ParseCommandActions::actOnBeginBuildDecl
          (ParseCommandActions *this,Token *name,ArrayRef<llbuild::ninja::Token> outputs,
          ArrayRef<llbuild::ninja::Token> inputs,uint numExplicitInputs,uint numImplicitInputs)

{
  Token *pTVar1;
  bool bVar2;
  ostream *poVar3;
  size_type sVar4;
  size_type sVar5;
  Token *pTVar6;
  iterator __begin2_1;
  Token *pTVar7;
  iterator __begin2;
  StringRef str;
  StringRef str_00;
  StringRef str_01;
  string local_58;
  size_type local_38;
  
  local_38 = inputs.Length;
  pTVar7 = inputs.Data;
  sVar4 = outputs.Length;
  pTVar6 = outputs.Data;
  sVar5 = sVar4;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"actOnBeginBuildDecl",0x13);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(/*Name=*/",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\"",1);
  str.Data = (char *)(ulong)name->length;
  str.Length = sVar5;
  llbuild::commands::util::escapedString_abi_cxx11_(&local_58,(util *)name->start,str);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_58._M_dataplus._M_p,local_58._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", /*Outputs=*/[",0xf);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (sVar4 != 0) {
    pTVar1 = pTVar6 + sVar4;
    bVar2 = true;
    do {
      if (!bVar2) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,", ",2);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\"",1);
      str_00.Data = (char *)(ulong)pTVar6->length;
      str_00.Length = sVar5;
      llbuild::commands::util::escapedString_abi_cxx11_(&local_58,(util *)pTVar6->start,str_00);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_58._M_dataplus._M_p,local_58._M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      pTVar6 = pTVar6 + 1;
      bVar2 = false;
    } while (pTVar6 != pTVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"], /*Inputs=*/[",0xf);
  if (local_38 != 0) {
    pTVar6 = pTVar7 + local_38;
    bVar2 = true;
    do {
      if (!bVar2) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,", ",2);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\"",1);
      str_01.Data = (char *)(ulong)pTVar7->length;
      str_01.Length = sVar5;
      llbuild::commands::util::escapedString_abi_cxx11_(&local_58,(util *)pTVar7->start,str_01);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_58._M_dataplus._M_p,local_58._M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      pTVar7 = pTVar7 + 1;
      bVar2 = false;
    } while (pTVar7 != pTVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"], /*NumExplicitInputs=*/",0x19);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", /*NumImplicitInputs=*/",0x18);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,")\n",2);
  return (BuildResult)0x0;
}

Assistant:

virtual BuildResult
  actOnBeginBuildDecl(const ninja::Token& name,
                      ArrayRef<ninja::Token> outputs,
                      ArrayRef<ninja::Token> inputs,
                      unsigned numExplicitInputs,
                      unsigned numImplicitInputs) override {
    std::cerr << __FUNCTION__ << "(/*Name=*/"
              << "\"" << escapedString(name) << "\""
              << ", /*Outputs=*/[";
    bool first = true;
    for (auto& name: outputs) {
      if (!first)
        std::cerr << ", ";
      std::cerr << "\"" << escapedString(name) << "\"";
      first = false;
    }
    std::cerr << "], /*Inputs=*/[";
    first = true;
    for (auto& name: inputs) {
      if (!first)
        std::cerr << ", ";
      std::cerr << "\"" << escapedString(name) << "\"";
      first = false;
    }
    std::cerr << "], /*NumExplicitInputs=*/" << numExplicitInputs
              << ", /*NumImplicitInputs=*/"  << numImplicitInputs << ")\n";
    return 0;
  }